

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

__pid_t __thiscall bsplib::Unbuf::wait(Unbuf *this,void *__stat_loc)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  MPI_Comm poVar5;
  __pid_t extraout_EAX;
  size_type sVar6;
  ompi_request_t **ppoVar7;
  int *piVar8;
  reference pvVar9;
  ulong __n;
  reference pvVar10;
  unsigned_long *puVar11;
  reference ppoVar12;
  int tag_1;
  char *next_addr_1;
  char *addr_1;
  size_t size_1;
  Entry *u_1;
  int tag;
  char *next_addr;
  char *addr;
  size_t size;
  Entry *u;
  size_t r;
  int i;
  int outcount;
  Unbuf *this_local;
  
  _i = this;
  while( true ) {
    r._4_4_ = -0x7ffe;
    sVar6 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size(&this->m_reqs);
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data(&this->m_reqs);
    piVar8 = std::vector<int,_std::allocator<int>_>::data(&this->m_ready);
    MPI_Waitsome(sVar6 & 0xffffffff,ppoVar7,(long)&r + 4,piVar8,0);
    if (r._4_4_ == -0x7ffe) break;
    for (r._0_4_ = 0; (int)r < r._4_4_; r._0_4_ = (int)r + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_ready,(long)(int)r);
      __n = (ulong)*pvVar9;
      sVar6 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                        (&this->m_recvs);
      if (__n < sVar6) {
        pvVar10 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::
                  operator[](&this->m_recvs,__n);
        puVar11 = std::min<unsigned_long>(&this->m_max_msg_size,&pvVar10->size);
        uVar3 = *puVar11;
        pcVar4 = pvVar10->addr;
        pvVar10->addr = pcVar4 + uVar3;
        pvVar10->size = pvVar10->size - uVar3;
        iVar1 = pvVar10->tag;
        if (uVar3 != 0) {
          iVar2 = pvVar10->pid;
          poVar5 = this->m_comm;
          ppoVar12 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                               (&this->m_reqs,__n);
          MPI_Irecv(pcVar4,uVar3 & 0xffffffff,&ompi_mpi_byte,iVar2,iVar1,poVar5,ppoVar12);
        }
      }
      else {
        sVar6 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                          (&this->m_recvs);
        pvVar10 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::
                  operator[](&this->m_sends,__n - sVar6);
        puVar11 = std::min<unsigned_long>(&this->m_max_msg_size,&pvVar10->size);
        uVar3 = *puVar11;
        pcVar4 = pvVar10->addr;
        pvVar10->addr = pcVar4 + uVar3;
        pvVar10->size = pvVar10->size - uVar3;
        iVar1 = pvVar10->tag;
        if (uVar3 != 0) {
          iVar2 = pvVar10->pid;
          poVar5 = this->m_comm;
          ppoVar12 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                               (&this->m_reqs,__n);
          MPI_Isend(pcVar4,uVar3 & 0xffffffff,&ompi_mpi_byte,iVar2,iVar1,poVar5,ppoVar12);
        }
      }
    }
  }
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::clear(&this->m_sends);
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::clear(&this->m_recvs);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::clear(&this->m_reqs);
  std::vector<int,_std::allocator<int>_>::clear(&this->m_ready);
  return extraout_EAX;
}

Assistant:

void Unbuf :: wait( ) 
{
    while (true)
    {
        int outcount = MPI_UNDEFINED;
        MPI_Waitsome( int(m_reqs.size()), m_reqs.data(), &outcount, 
                m_ready.data(), MPI_STATUSES_IGNORE );
    
        if (outcount == MPI_UNDEFINED )
            break;

        for (int i = 0; i < outcount; ++i ) {
            size_t r = m_ready[i];

            if (r < m_recvs.size()) {
               Entry & u = m_recvs[r];
               size_t size = std::min( m_max_msg_size, u.size );
               char * addr = const_cast<char *>( u.addr );
               char * next_addr = addr + size;
               u.addr = next_addr;
               u.size -= size;
               const int tag = u.tag;
               
               if (size > 0) 
                MPI_Irecv( addr, int(size), MPI_BYTE, 
                           u.pid, tag, m_comm, &m_reqs[r]);
            }
            else
            {
               Entry & u = m_sends[r - m_recvs.size()];
               size_t size = std::min( m_max_msg_size, u.size );
               char * addr = const_cast<char *>( u.addr );
               char * next_addr = addr  + size;
               u.addr = next_addr;
               u.size -= size;
               const int tag = u.tag;

               if (size > 0)
                MPI_Isend(addr, int(size), MPI_BYTE, 
                          u.pid, tag, m_comm, &m_reqs[r]);
            }
        }
    }

    m_sends.clear();
    m_recvs.clear();
    m_reqs.clear();
    m_ready.clear();
}